

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  MessageLite *this_00;
  Arena *arena;
  RepeatedPtrFieldBase *this_01;
  int iVar1;
  int iVar2;
  char *failure_msg;
  void **ppvVar3;
  void **ppvVar4;
  long lVar5;
  undefined4 extraout_var;
  MessageLite *this_02;
  Rep *pRVar6;
  LogMessage *pLVar7;
  void **ppvVar8;
  string_view sVar9;
  LogMessage local_58;
  int local_44;
  RepeatedPtrFieldBase *local_40;
  RepeatedPtrFieldBase *local_38;
  
  local_58._0_8_ = from;
  local_38 = this;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::internal::RepeatedPtrFieldBase_const*,google::protobuf::internal::RepeatedPtrFieldBase*>
                          ((RepeatedPtrFieldBase **)&local_58,&local_38,"&from != this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    if (from->current_size_ < 1) {
      failure_msg = "from.current_size_ > 0";
      iVar2 = 0xe1;
    }
    else {
      local_44 = from->current_size_ + this->current_size_;
      ppvVar3 = InternalReserve(this,local_44);
      ppvVar4 = elements(from);
      this_00 = (MessageLite *)*ppvVar4;
      if (this_00 == (MessageLite *)0x0) {
        failure_msg = "prototype != nullptr";
        iVar2 = 0xe7;
      }
      else {
        iVar2 = from->current_size_;
        iVar1 = ClearedCount(this);
        ppvVar8 = ppvVar4;
        local_40 = this;
        if (0 < iVar1) {
          iVar1 = MergeIntoClearedMessages(this,from);
          ppvVar3 = ppvVar3 + iVar1;
          ppvVar8 = ppvVar4 + iVar1;
        }
        arena = local_40->arena_;
        while( true ) {
          this_01 = local_40;
          iVar1 = local_44;
          if (ppvVar4 + iVar2 <= ppvVar8) {
            local_40->current_size_ = local_44;
            iVar2 = allocated_size(local_40);
            if (iVar2 < iVar1) {
              pRVar6 = rep(this_01);
              pRVar6->allocated_size = iVar1;
            }
            return;
          }
          if ((long *)*ppvVar8 == (long *)0x0) break;
          lVar5 = (**(code **)(**ppvVar8 + 0x20))();
          iVar1 = (*this_00->_vptr_MessageLite[4])(this_00);
          if (lVar5 != CONCAT44(extraout_var,iVar1)) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_58,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
                       ,0xf0,"TypeId::Get(**src) == TypeId::Get(*prototype)");
            sVar9 = MessageLite::GetTypeName((MessageLite *)*ppvVar8);
            pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_58,sVar9);
            pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar7,(char (*) [5])" vs ");
            sVar9 = MessageLite::GetTypeName(this_00);
            absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,sVar9);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_58);
          }
          this_02 = MessageLite::New(this_00,arena);
          *ppvVar3 = this_02;
          MessageLite::CheckTypeAndMergeFrom(this_02,(MessageLite *)*ppvVar8);
          ppvVar8 = ppvVar8 + 1;
          ppvVar3 = ppvVar3 + 1;
        }
        failure_msg = "*src != nullptr";
        iVar2 = 0xef;
      }
    }
  }
  else {
    iVar2 = 0xe0;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
             ,iVar2,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_58);
}

Assistant:

void RepeatedPtrFieldBase::MergeFrom<MessageLite>(
    const RepeatedPtrFieldBase& from) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  ABSL_DCHECK(from.current_size_ > 0);
  int new_size = current_size_ + from.current_size_;
  auto dst = reinterpret_cast<MessageLite**>(InternalReserve(new_size));
  auto src = reinterpret_cast<MessageLite const* const*>(from.elements());
  auto end = src + from.current_size_;
  const MessageLite* prototype = src[0];
  ABSL_DCHECK(prototype != nullptr);
  if (ABSL_PREDICT_FALSE(ClearedCount() > 0)) {
    int recycled = MergeIntoClearedMessages(from);
    dst += recycled;
    src += recycled;
  }
  Arena* arena = GetArena();
  for (; src < end; ++src, ++dst) {
    ABSL_DCHECK(*src != nullptr);
    ABSL_DCHECK(TypeId::Get(**src) == TypeId::Get(*prototype))
        << (**src).GetTypeName() << " vs " << prototype->GetTypeName();
    *dst = prototype->New(arena);
    (*dst)->CheckTypeAndMergeFrom(**src);
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}